

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
OpenMD::SimInfo::getGlobalGroupIndices
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,SimInfo *this)

{
  _Base_ptr p_Var1;
  iterator __position;
  undefined8 in_RAX;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  undefined8 uStack_38;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var2 = (this->molecules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(this->molecules_)._M_t._M_impl.super__Rb_tree_header;
  if (((_Rb_tree_header *)p_Var2 != p_Var5) &&
     (p_Var4 = p_Var2[1]._M_parent, p_Var4 != (_Base_ptr)0x0)) {
    uStack_38 = in_RAX;
    do {
      p_Var3 = p_Var4[5]._M_right;
      if (p_Var3 != *(_Base_ptr *)(p_Var4 + 6)) {
        p_Var1 = *(_Base_ptr *)p_Var3;
        while (p_Var1 != (_Base_ptr)0x0) {
          p_Var3 = (_Base_ptr)&p_Var3->_M_parent;
          uStack_38 = CONCAT44(*(int *)&p_Var1[1]._M_parent,(undefined4)uStack_38);
          __position._M_current =
               (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (__return_storage_ptr__,__position,(int *)((long)&uStack_38 + 4));
          }
          else {
            *__position._M_current = *(int *)&p_Var1[1]._M_parent;
            (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          if (p_Var3 == (_Base_ptr)*(undefined1 **)(p_Var4 + 6)) break;
          p_Var1 = *(_Base_ptr *)p_Var3;
        }
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while (((_Rb_tree_header *)p_Var2 != p_Var5) &&
            (p_Var4 = p_Var2[1]._M_parent, p_Var4 != (_Base_ptr)0x0));
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int> SimInfo::getGlobalGroupIndices() {
    SimInfo::MoleculeIterator mi;
    Molecule* mol;
    Molecule::CutoffGroupIterator ci;
    CutoffGroup* cg;

    vector<int> GlobalGroupIndices;

    for (mol = beginMolecule(mi); mol != NULL; mol = nextMolecule(mi)) {
      // local index of cutoff group is trivial, it only depends on the
      // order of travesing
      for (cg = mol->beginCutoffGroup(ci); cg != NULL;
           cg = mol->nextCutoffGroup(ci)) {
        GlobalGroupIndices.push_back(cg->getGlobalIndex());
      }
    }
    return GlobalGroupIndices;
  }